

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  bool bVar1;
  Enum EVar2;
  Enum EVar3;
  char *pcVar4;
  char *pcVar5;
  string local_70;
  Enum local_50;
  Enum local_4c;
  string local_48;
  string *local_28;
  string *out_msg_local;
  GlobalType *actual_local;
  GlobalType *expected_local;
  
  local_28 = out_msg;
  out_msg_local = (string *)actual;
  actual_local = expected;
  if (actual->mut != expected->mut) {
    pcVar4 = GetName(actual->mut);
    pcVar5 = GetName(actual_local->mut);
    StringPrintf_abi_cxx11_
              (&local_48,"mutability mismatch in imported global, expected %s but got %s.",pcVar4,
               pcVar5);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    Result::Result((Result *)((long)&expected_local + 4),Error);
    return (Result)expected_local._4_4_;
  }
  EVar2 = Type::operator_cast_to_Enum((Type *)&(actual->super_ExternType).field_0xc);
  EVar3 = Type::operator_cast_to_Enum((Type *)&(actual_local->super_ExternType).field_0xc);
  if (EVar2 == EVar3) {
LAB_0027f399:
    Result::Result((Result *)((long)&expected_local + 4),Ok);
  }
  else {
    if (actual_local->mut != Var) {
      local_4c = *(Enum *)&(actual_local->super_ExternType).field_0xc;
      local_50 = *(Enum *)((long)&out_msg_local->_M_string_length + 4);
      bVar1 = TypesMatch((ValueType)local_4c,(ValueType)local_50);
      if (bVar1) goto LAB_0027f399;
    }
    pcVar4 = GetName((ValueType)*(Enum *)&(actual_local->super_ExternType).field_0xc);
    pcVar5 = GetName((ValueType)*(Enum *)((long)&out_msg_local->_M_string_length + 4));
    StringPrintf_abi_cxx11_
              (&local_70,"type mismatch in imported global, expected %s but got %s.",pcVar4,pcVar5);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    Result::Result((Result *)((long)&expected_local + 4),Error);
  }
  return (Result)expected_local._4_4_;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type), GetName(actual.type));
    return Result::Error;
  }

  return Result::Ok;
}